

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O2

string * __thiscall Kernel::Clause::toString_abi_cxx11_(string *__return_storage_ptr__,Clause *this)

{
  SplitSet *pSVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Color CVar5;
  TermList *this_00;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint i;
  uint i_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  uint i_01;
  int extraout_EDX_03;
  uint i_02;
  int extraout_EDX_04;
  int i_03;
  int extraout_EDX_05;
  int extraout_EDX_06;
  uint i_04;
  int extraout_EDX_07;
  int extraout_EDX_08;
  uint i_05;
  int extraout_EDX_09;
  int i_06;
  VirtualIterator<unsigned_int> *it;
  SplitSet *splits;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *this_01;
  Entry *pEVar6;
  Stack<unsigned_int> vars;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> varSortMap;
  string quantifier;
  undefined1 auStack_148 [32];
  DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 local_c0 [16];
  Clause *local_b0;
  string *local_a8;
  Entry *local_a0;
  TermList local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"",(allocator<char> *)&local_128);
  uVar3 = extraout_EDX;
  if ((Lib::env->_proofExtra).super_OptionValue<Shell::Options::ProofExtra>.actualValue != OFF) {
    local_128._timestamp = 1;
    local_128._size = 0;
    local_128._deleted = 0;
    local_128._capacityIndex = 0;
    local_128._capacity = 0;
    local_128._20_8_ = 0;
    local_128._28_8_ = 0;
    local_128._afterLast._4_4_ = 0;
    SortHelper::collectVariableSorts(&this->super_Unit,&local_128);
    Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::domain
              ((DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)
               local_c0);
    Lib::Stack<unsigned_int>::fromIterator<Lib::VirtualIterator<unsigned_int>>
              ((Stack<unsigned_int> *)auStack_148,(Stack<unsigned_int> *)local_c0,it);
    Lib::VirtualIterator<unsigned_int>::~VirtualIterator((VirtualIterator<unsigned_int> *)local_c0);
    Lib::Stack<unsigned_int>::sort<std::less<unsigned_int>>((Stack<unsigned_int> *)auStack_148);
    iVar2 = (int)((ulong)(auStack_148._16_8_ - auStack_148._8_8_) >> 2);
    if (iVar2 != 0) {
      std::__cxx11::string::append((char *)&local_90);
      local_a0 = (Entry *)auStack_148._16_8_;
      local_c0._8_8_ = ZEXT48(iVar2 - 1);
      local_b0 = this;
      local_a8 = __return_storage_ptr__;
      for (pEVar6 = (Entry *)auStack_148._8_8_; pEVar6 != local_a0; pEVar6 = (Entry *)&pEVar6->_key)
      {
        uVar3 = (pEVar6->field_0)._infoData;
        local_98._content = (uint64_t)(uVar3 * 4 + 1);
        TermList::toString_abi_cxx11_(&local_70,&local_98,false);
        std::operator+(&local_e0,&local_70,":");
        this_00 = Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::
                  get(&local_128,uVar3);
        TermList::toString_abi_cxx11_(&local_50,this_00,false);
        std::operator+(&local_100,&local_e0,&local_50);
        std::__cxx11::string::append((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_100);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_70);
        iVar2 = (int)local_c0._8_8_;
        local_c0._8_8_ = ZEXT48(iVar2 - 1);
        if (iVar2 != 0) {
          std::__cxx11::string::append((char *)&local_90);
        }
      }
      std::__cxx11::string::append((char *)&local_90);
      __return_storage_ptr__ = local_a8;
      this = local_b0;
    }
    Lib::Stack<unsigned_int>::~Stack((Stack<unsigned_int> *)auStack_148);
    Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
              (&local_128);
    uVar3 = extraout_EDX_00;
  }
  Lib::Int::toString_abi_cxx11_(&local_100,(Int *)(ulong)(this->super_Unit)._number,uVar3);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_148,
                 &local_100,". ");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_128,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_148,
                 &local_90);
  literalsOnlyToString_abi_cxx11_(&local_e0,this);
  std::operator+(__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_128,
                 &local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)auStack_148);
  std::__cxx11::string::~string((string *)&local_100);
  pSVar1 = (this->super_Unit)._inference._splits;
  if ((pSVar1 != (SplitSet *)0x0) && (pSVar1->_size != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100," <- (",(allocator<char> *)&local_70);
    Saturation::Splitter::splitsToString_abi_cxx11_
              (&local_e0,(Splitter *)(this->super_Unit)._inference._splits,splits);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_148,
                   &local_100,&local_e0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_128,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_148,
                   ")");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)auStack_148);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
  }
  Unit::inferenceAsString_abi_cxx11_((string *)auStack_148,&this->super_Unit);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_128," "
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_148);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)auStack_148);
  if ((Lib::env->_proofExtra).super_OptionValue<Shell::Options::ProofExtra>.actualValue != OFF) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128," {",(allocator<char> *)auStack_148);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)auStack_148,"a:",(allocator<char> *)&local_e0);
    Lib::Int::toString_abi_cxx11_(&local_100,(Int *)(ulong)(this->super_Unit)._inference._age,i);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_128,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_148,
                   &local_100);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)auStack_148);
    uVar3 = this->_weight;
    if (uVar3 == 0) {
      uVar3 = computeWeight(this);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)auStack_148,",w:",(allocator<char> *)&local_e0);
    Lib::Int::toString_abi_cxx11_(&local_100,(Int *)(ulong)uVar3,i_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_128,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_148,
                   &local_100);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)auStack_148);
    uVar4 = this->_weightForClauseSelection;
    iVar2 = extraout_EDX_01;
    if (uVar4 == 0) {
      uVar4 = computeWeightForClauseSelection(this,Lib::env);
      iVar2 = extraout_EDX_02;
    }
    if (uVar4 != uVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)auStack_148,",wCS:",(allocator<char> *)&local_e0);
      Lib::Int::toString_abi_cxx11_(&local_100,(Int *)(ulong)uVar4,i_01);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_128
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      auStack_148,&local_100);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)auStack_148);
      iVar2 = extraout_EDX_03;
    }
    if ((*(uint *)&this->field_0x3b & 0xfffff00) != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)auStack_148,",nSel:",(allocator<char> *)&local_e0);
      Lib::Int::toString_abi_cxx11_
                (&local_100,(Int *)(ulong)(*(uint *)&this->field_0x3c & 0xfffff),i_02);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_128
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      auStack_148,&local_100);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)auStack_148);
      iVar2 = extraout_EDX_04;
    }
    if (DAT_00a141e0 == '\x01') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)auStack_148,",col:",(allocator<char> *)&local_e0);
      CVar5 = color(this);
      Lib::Int::toString_abi_cxx11_(&local_100,(Int *)(ulong)CVar5,i_03);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_128
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      auStack_148,&local_100);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)auStack_148);
      iVar2 = extraout_EDX_05;
    }
    if ((undefined1  [48])((undefined1  [48])(this->super_Unit)._inference & (undefined1  [48])0x18)
        != (undefined1  [48])0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_128,",goal:1",(allocator<char> *)auStack_148);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_128);
      iVar2 = extraout_EDX_06;
    }
    if (1 < DAT_00a141a8) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)auStack_148,",sine:",(allocator<char> *)&local_e0);
      Lib::Int::toString_abi_cxx11_
                (&local_100,(Int *)(ulong)(byte)(this->super_Unit)._inference.field_0x4,i_04);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_128
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      auStack_148,&local_100);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)auStack_148);
      iVar2 = extraout_EDX_07;
    }
    if (((this->super_Unit)._inference.field_0x2 & 2) != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_128,",ptD:1",(allocator<char> *)auStack_148);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_128);
      iVar2 = extraout_EDX_08;
    }
    if ((Lib::env->_induction).super_OptionValue<Shell::Options::Induction>.actualValue != NONE) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)auStack_148,",inD:",(allocator<char> *)&local_e0);
      Lib::Int::toString_abi_cxx11_
                (&local_100,(Int *)(ulong)(*(uint *)&(this->super_Unit)._inference >> 0x15 & 0x1f),
                 i_05);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_128
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      auStack_148,&local_100);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)auStack_148);
      iVar2 = extraout_EDX_09;
    }
    Lib::Int::toString_abi_cxx11_
              ((string *)auStack_148,
               (Int *)(ulong)(uint)(int)(this->super_Unit)._inference.th_ancestors,iVar2);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_128,
                   ",thAx:",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            auStack_148);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)auStack_148);
    Lib::Int::toString_abi_cxx11_
              ((string *)auStack_148,
               (Int *)(ulong)(uint)(int)(this->super_Unit)._inference.all_ancestors,i_06);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_128,
                   ",allAx:",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_148)
    ;
    this_01 = &local_128;
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)auStack_148);
    Lib::Int::toString_abi_cxx11_
              ((string *)auStack_148,(Int *)this_01,
               (float)(Lib::env->_theorySplitQueueExpectedRatioDenom).super_OptionValue<int>.
                      actualValue * (this->super_Unit)._inference.th_ancestors -
               (this->super_Unit)._inference.all_ancestors);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_128,
                   ",thDist:",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_148)
    ;
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)auStack_148);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,"}",(allocator<char> *)auStack_148);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_128);
  }
  std::__cxx11::string::~string((string *)&local_90);
  return __return_storage_ptr__;
}

Assistant:

std::string Clause::toString() const
{
  std::string quantifier = "";
  if(env.options->proofExtra() != Options::ProofExtra::OFF){
    DHMap<unsigned,TermList> varSortMap;
    SortHelper::collectVariableSorts(const_cast<Clause*>(this),varSortMap);
    auto vars = Stack<unsigned>::fromIterator(varSortMap.domain());
    vars.sort();
    unsigned numVars = vars.size();
    if (numVars) {
      quantifier += "![";
      for (auto var : vars) {
        quantifier += TermList(var,false).toString() + ":" + varSortMap.get(var).toString();
        if (--numVars) {
          quantifier += ", ";
        }
      }
      quantifier += "]: ";
    }
  }

  // print id and literals of clause
  std::string result = Int::toString(_number) + ". "+ quantifier + literalsOnlyToString();

  // print avatar components clause depends on
  if (splits() && !splits()->isEmpty()) {
    result += std::string(" <- (") + Splitter::splitsToString(splits()) + ")";
  }

  // print inference and ids of parent clauses
  result += " " + inferenceAsString();

  if(env.options->proofExtra() != Options::ProofExtra::OFF){
    // print statistics: each entry should have the form key:value
    result += std::string(" {");

    result += std::string("a:") + Int::toString(age());
    unsigned weight = (_weight ? _weight : computeWeight());
    result += std::string(",w:") + Int::toString(weight);

    unsigned weightForClauseSelection = (_weightForClauseSelection ? _weightForClauseSelection : computeWeightForClauseSelection(*env.options));
    if(weightForClauseSelection!=weight){
      result += std::string(",wCS:") + Int::toString(weightForClauseSelection);
    }

    if (numSelected()>0) {
      result += std::string(",nSel:") + Int::toString(numSelected());
    }

    if (env.colorUsed) {
      result += std::string(",col:") + Int::toString(color());
    }

    if(derivedFromGoal()){
      result += std::string(",goal:1");
    }
    if(env.maxSineLevel > 1) { // this is a cryptic way of saying "did we run Sine to compute sine levels?"
      result += std::string(",sine:")+Int::toString((unsigned)_inference.getSineLevel());
    }

    if(isPureTheoryDescendant()){
      result += std::string(",ptD:1");
    }

    if(env.options->induction() != Shell::Options::Induction::NONE){
      result += std::string(",inD:") + Int::toString(_inference.inductionDepth());
    }
    result += ",thAx:" + Int::toString((int)(_inference.th_ancestors));
    result += ",allAx:" + Int::toString((int)(_inference.all_ancestors));

    result += ",thDist:" + Int::toString( _inference.th_ancestors * env.options->theorySplitQueueExpectedRatioDenom() - _inference.all_ancestors);
    result += std::string("}");
  }

  return result;
}